

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv1_cm_gears.c
# Opt level: O3

void glesv1_cm_gears_draw
               (gears_t_conflict *gears,float view_tz,float view_rx,float view_ry,float model_rz)

{
  float blue [4];
  float green [4];
  float red [4];
  float local_38 [12];
  
  local_38[8] = 0.8;
  local_38[9] = 0.1;
  local_38[10] = 0.0;
  local_38[0xb] = 1.0;
  local_38[4] = 0.0;
  local_38[5] = 0.8;
  local_38[6] = 0.2;
  local_38[7] = 1.0;
  local_38[0] = 0.2;
  local_38[1] = 0.2;
  local_38[2] = 1.0;
  local_38[3] = 1.0;
  if (gears != (gears_t_conflict *)0x0) {
    (*gears->glClear)(0x4100);
    (*gears->glLoadIdentity)();
    (*gears->glTranslatef)(0.0,0.0,view_tz);
    (*gears->glRotatef)(view_rx,1.0,0.0,0.0);
    (*gears->glRotatef)(view_ry,0.0,1.0,0.0);
    draw_gear(gears,0,-3.0,-2.0,model_rz,local_38 + 8);
    draw_gear(gears,1,3.1,-2.0,model_rz * -2.0 + -9.0,local_38 + 4);
    draw_gear(gears,2,-3.1,4.2,model_rz * -2.0 + -25.0,local_38);
  }
  return;
}

Assistant:

static void glesv1_cm_gears_draw(gears_t *gears, float view_tz, float view_rx, float view_ry, float model_rz)
{
  const float red[4] = { 0.8, 0.1, 0.0, 1.0 };
  const float green[4] = { 0.0, 0.8, 0.2, 1.0 };
  const float blue[4] = { 0.2, 0.2, 1.0, 1.0 };

  if (!gears) {
    return;
  }

  gears->glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

  gears->glLoadIdentity();
  gears->glTranslatef(0, 0, view_tz);
  gears->glRotatef(view_rx, 1, 0, 0);
  gears->glRotatef(view_ry, 0, 1, 0);

  draw_gear(gears, GEAR0, -3.0, -2.0,      model_rz     , red);
  draw_gear(gears, GEAR1,  3.1, -2.0, -2 * model_rz - 9 , green);
  draw_gear(gears, GEAR2, -3.1,  4.2, -2 * model_rz - 25, blue);
}